

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  undefined4 uStack_1c;
  
  sVar3 = 0;
  if (mode != ZSTD_cpm_attachDict) {
    sVar3 = dictSize;
  }
  uVar1 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || sVar3 != 0) {
    lVar2 = 500;
    if (sVar3 == 0) {
      lVar2 = 0;
    }
    lVar5 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar5 = lVar2;
    }
    uVar1 = sVar3 + srcSizeHint + lVar5;
  }
  if (compressionLevel == 0) {
    uVar4 = 3;
  }
  else if (compressionLevel < 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0x16;
    if (compressionLevel < 0x16) {
      uVar4 = (ulong)(uint)compressionLevel;
    }
  }
  lVar5 = ((ulong)(uVar1 < 0x20001) + (ulong)(uVar1 < 0x40001) + (ulong)(uVar1 < 0x4001)) * 0x284;
  lVar2 = uVar4 * 0x1c;
  uStack_1c = (undefined4)
              ((ulong)*(undefined8 *)
                       (*(undefined1 (*) [12])(ZSTD_defaultCParameters + lVar2 + lVar5) + 8) >> 0x20
              );
  iVar6 = -0x20000;
  if (-0x20000 < compressionLevel) {
    iVar6 = compressionLevel;
  }
  if (compressionLevel < 0) {
    iVar6 = -iVar6;
  }
  else {
    iVar6 = *(int *)(lVar5 + 0x1f95524 + lVar2);
  }
  cPar.strategy = *(undefined4 *)(lVar5 + 0x1f95528 + lVar2);
  cPar.targetLength = iVar6;
  cPar.searchLog = uStack_1c;
  cPar._0_12_ = *(undefined1 (*) [12])(ZSTD_defaultCParameters + lVar2 + lVar5);
  cPar.minMatch = *(undefined4 *)(lVar5 + 0x1f95520 + lVar2);
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}